

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O3

void __thiscall
AI::HierarchicalTaskNetworkComponent::senseAuditory(HierarchicalTaskNetworkComponent *this)

{
  pointer *ppSVar1;
  Vector2<float> position;
  iterator __position;
  Stimulus stimulus;
  World *this_00;
  GameMode *this_01;
  SoundMap *this_02;
  mapped_type *pmVar2;
  mapped_type_conflict *pmVar3;
  SoundWave *wave;
  pointer pSVar4;
  float fVar5;
  vector<AI::SoundWave,_std::allocator<AI::SoundWave>_> sounds;
  key_type local_7c;
  Vector2<float> local_78;
  float fStack_70;
  undefined4 uStack_6c;
  anon_union_16_2_91a068c6_for_Stimulus_3 local_68;
  StimulusType local_58;
  uint uStack_54;
  vector<AI::Stimulus,std::allocator<AI::Stimulus>> *local_50;
  vector<AI::SoundWave,_std::allocator<AI::SoundWave>_> local_48;
  
  this_00 = Component::getWorld(&this->super_Component);
  this_01 = World::getAuthGameMode(this_00);
  this_02 = GameMode::getSoundMap(this_01);
  local_78.x = 7.00649e-45;
  pmVar2 = std::
           map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
           ::operator[](&(this->state).current.vectors,(key_type *)&local_78);
  position.x = pmVar2->x;
  position.y = pmVar2->y;
  SoundMap::collectSounds(&local_48,this_02,position,10);
  if (local_48.super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_50 = (vector<AI::Stimulus,std::allocator<AI::Stimulus>> *)&(this->state).memory;
    pSVar4 = local_48.super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      fVar5 = pSVar4->intensity;
      if (10.0 <= fVar5) {
        local_58 = Auditory;
        local_78 = pSVar4->originalPosition;
        local_68.auditory.tag = (Auditory)pSVar4->tag;
        __position._M_current =
             (this->state).memory.sensoryMemory.
             super__Vector_base<AI::Stimulus,_std::allocator<AI::Stimulus>_>._M_impl.
             super__Vector_impl_data._M_finish;
        fStack_70 = fVar5;
        if (__position._M_current ==
            (this->state).memory.sensoryMemory.
            super__Vector_base<AI::Stimulus,_std::allocator<AI::Stimulus>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<AI::Stimulus,std::allocator<AI::Stimulus>>::
          _M_realloc_insert<AI::Stimulus_const&>(local_50,__position,(Stimulus *)&local_78);
        }
        else {
          *(ulong *)&(__position._M_current)->type = (ulong)uStack_54 << 0x20;
          *(ulong *)&(__position._M_current)->field_3 = CONCAT44(local_68._4_4_,local_68.visual.tag)
          ;
          ((__position._M_current)->field_3).visual.target = local_68.visual.target;
          (__position._M_current)->x = local_78.x;
          (__position._M_current)->y = local_78.y;
          *(ulong *)&(__position._M_current)->intensity = CONCAT44(uStack_6c,fVar5);
          ppSVar1 = &(this->state).memory.sensoryMemory.
                     super__Vector_base<AI::Stimulus,_std::allocator<AI::Stimulus>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + 1;
        }
        stimulus._36_4_ = uStack_54;
        stimulus.type = local_58;
        stimulus._12_4_ = uStack_6c;
        stimulus.intensity = fStack_70;
        stimulus.field_3._4_4_ = local_68._4_4_;
        stimulus.field_3.visual.tag = local_68.visual.tag;
        stimulus.x = local_78.x;
        stimulus.y = local_78.y;
        stimulus.field_3.visual.target = local_68.visual.target;
        encodeEngramIfUnique(stimulus,&(this->state).memory.shortTermMemory);
        local_7c = Curiosity;
        pmVar3 = std::
                 map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
                 ::operator[](&(this->state).current.values,&local_7c);
        fVar5 = Math::clamp(fStack_70 / 10.0 + *pmVar3,0.0,100.0);
        *pmVar3 = fVar5;
      }
      pSVar4 = pSVar4 + 1;
    } while (pSVar4 != local_48.super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_48.super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::senseAuditory()
{
	auto& soundMap = getWorld()->getAuthGameMode()->getSoundMap();

	auto location = state.current.vectors[WorldStateIdentifier::CurrentPosition];

	auto range = 10.f;
	auto sounds = soundMap.collectSounds({location.x, location.y}, range);
	
	const float MINIMUM_INTENSITY_HACK = 10.f;

	for (auto& wave : sounds)
	{
		if (wave.intensity < MINIMUM_INTENSITY_HACK)
			continue;

		Stimulus stimulus;
		stimulus.type = StimulusType::Auditory;
		stimulus.intensity = wave.intensity;
		stimulus.x = wave.originalPosition.x;
		stimulus.y = wave.originalPosition.y;
		stimulus.auditory.tag = wave.tag;

		state.memory.sensoryMemory.push_back(stimulus);

		encodeEngramIfUnique(stimulus, state.memory.shortTermMemory);

		//auto& alertness = state.current.values[WorldStateIdentifier::Alertness];
		//alertness = FMath::Clamp(alertness + stimulus.auditory.intensity / 100.f, 0.f, 60.f);
		auto& curiosity = state.current.values[WorldStateIdentifier::Curiosity];
		curiosity = clamp(curiosity + stimulus.intensity / 10.f, 0.f, 100.f);
	}	
}